

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

int __thiscall
CVmObjHTTPRequest::getp_getClientAddress
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  char *__s;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  size_t len;
  
  if (getp_getClientAddress(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getClientAddress();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getClientAddress::desc);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    lVar1 = *(long *)(*(long *)(this->super_CVmObject).ext_ + 0x38);
    vVar5 = *(vm_obj_id_t *)(lVar1 + 0x78);
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_INT;
    (pvVar3->val).obj = vVar5;
    __s = *(char **)(lVar1 + 0x70);
    len = strlen(__s);
    CVmRun::push_string(&G_interpreter_X,__s,len);
    vVar5 = CVmObjList::create_from_stack((uchar **)0x0,2);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getClientAddress(VMG_ vm_obj_id_t self,
                                             vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsServerThread *t = req->thread;

    /* set up the return list, using address information from the thread */
    G_interpreter->push_int(vmg_ t->get_client_port());
    G_interpreter->push_string(vmg_ t->get_client_ip());
    retval->set_obj(CVmObjList::create_from_stack(vmg_ 0, 2));
    
    /* handled */
    return TRUE;
}